

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O2

ExprNode * __thiscall Parser::arithExpr(Parser *this)

{
  InfixExprNode *pIVar1;
  InfixExprNode *this_00;
  ExprNode **ppEVar2;
  ExprNode *pEVar3;
  Token op;
  Token local_180;
  Token local_110;
  Token local_a0;
  
  pIVar1 = (InfixExprNode *)term(this);
  Tokenizer::getToken(&local_180,this->tokenizer);
  while ((local_180._symbol == '-' || (local_180._symbol == '+'))) {
    this_00 = (InfixExprNode *)operator_new(0x90);
    Token::Token(&local_110,&local_180);
    InfixExprNode::InfixExprNode(this_00,&local_110);
    Token::~Token(&local_110);
    ppEVar2 = InfixExprNode::left(this_00);
    *ppEVar2 = &pIVar1->super_ExprNode;
    pEVar3 = term(this);
    ppEVar2 = InfixExprNode::right(this_00);
    *ppEVar2 = pEVar3;
    Tokenizer::getToken(&local_a0,this->tokenizer);
    Token::operator=(&local_180,&local_a0);
    Token::~Token(&local_a0);
    pIVar1 = this_00;
  }
  Tokenizer::ungetToken(this->tokenizer);
  Token::~Token(&local_180);
  return &pIVar1->super_ExprNode;
}

Assistant:

ExprNode *Parser::arithExpr() {
    // arith_expr: term { ( + | - ) term}*

    ExprNode *left = term();
    Token op = tokenizer.getToken();
    while (op.isArithmeticOperator()) {
        auto *p = new InfixExprNode(op);
        p->left() = left;
        p->right() = term();
        left = p;
        op = tokenizer.getToken();
    }
    tokenizer.ungetToken();
    return left;
}